

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.h
# Opt level: O1

pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_> * __thiscall
vmips::Function::
branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
          (pair<std::shared_ptr<vmips::CFGNode>,_std::shared_ptr<vmips::CFGNode>_>
           *__return_storage_ptr__,Function *this,shared_ptr<vmips::VirtReg> *args,
          shared_ptr<vmips::VirtReg> *args_1)

{
  CFGNode *this_00;
  string b;
  string a;
  string local_b0;
  string local_90;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  vmips::Function::next_name_abi_cxx11_();
  vmips::Function::next_name_abi_cxx11_();
  this_00 = *(CFGNode **)(this + 0x148);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_50,local_50 + local_48);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_70,local_70 + local_68);
  CFGNode::branch<vmips::beq,std::shared_ptr<vmips::VirtReg>&,std::shared_ptr<vmips::VirtReg>&>
            (__return_storage_ptr__,this_00,&local_b0,&local_90,args,args_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (*(CFGNode **)(this + 0x148) != *(CFGNode **)(*(long *)(this + 0x138) + -0x10)) {
    CFGNode::branch_existing<vmips::j>(*(CFGNode **)(this + 0x148),&__return_storage_ptr__->first);
  }
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
             *)(this + 0x130),&__return_storage_ptr__->first);
  std::vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>::
  push_back((vector<std::shared_ptr<vmips::CFGNode>,_std::allocator<std::shared_ptr<vmips::CFGNode>_>_>
             *)(this + 0x130),&__return_storage_ptr__->second);
  vmips::Function::switch_to(this);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::shared_ptr<CFGNode>, std::shared_ptr<CFGNode>> branch(Args &&... args) {
            auto a = next_name();
            auto b = next_name();
            auto ret = cursor->template branch<Instr, Args...>(a, b, std::forward<Args>(args)...);
            if (cursor != blocks.back()) cursor->branch_existing<vmips::j>(ret.first);
            blocks.push_back(ret.first);
            blocks.push_back(ret.second);
            switch_to(ret.first);
            return ret;
        }